

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.hpp
# Opt level: O0

int32_t __thiscall
poincare_disc::
Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getLine(Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,ifstream *ifs,vector<int,_std::allocator<int>_> *words)

{
  Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_t *wid;
  string token;
  int32_t ntokens;
  uniform_real_distribution<double> uniform;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  string local_50 [36];
  int local_2c;
  
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             6.09922557594081e-318);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x12d64e);
  local_2c = 0;
  std::__cxx11::string::string(local_50);
  while( true ) {
    in_stack_ffffffffffffff87 =
         readWord(in_RDI,(ifstream *)
                         CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                  (string *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff86 = false;
    if ((bool)in_stack_ffffffffffffff87) {
      in_stack_ffffffffffffff86 =
           std::operator!=(in_stack_ffffffffffffff70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    if ((bool)in_stack_ffffffffffffff86 == false) break;
    in_stack_ffffffffffffff78 =
         (Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)get_hash(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_2c = local_2c + 1;
    if (in_stack_ffffffffffffff78 ==
        (Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      in_stack_ffffffffffffff70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           get_hash((Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0,in_stack_ffffffffffffff70);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  std::__cxx11::string::~string(local_50);
  return local_2c;
}

Assistant:

const int32_t getLine(std::ifstream& ifs, std::vector<int32_t>& words) {
        std::uniform_real_distribution<> uniform(0, 1);

        words.clear();
        int32_t ntokens = 0;
        std::string token;
        while (this->readWord(ifs, token) && token != EOS) {
            size_t* wid = get_hash(token);
            ntokens++;
            if(wid) {
                words.push_back(*wid);       
            } else {
                wid = get_hash(UNK);
                words.push_back(*wid);       
            }
        }
        return ntokens;
    }